

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O2

void __thiscall Material::setAlbedoTexture(Material *this,string *filePath)

{
  pointer *__ptr;
  _Alloc_hider local_28;
  __shared_ptr<fw::Texture,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_unique<fw::Texture,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::__shared_ptr<fw::Texture,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fw::Texture,std::default_delete<fw::Texture>,void>
            ((__shared_ptr<fw::Texture,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_> *)&local_28);
  std::__shared_ptr<fw::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_albedoTexture).super___shared_ptr<fw::Texture,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  if ((long *)local_28._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_28._M_p + 8))();
  }
  return;
}

Assistant:

void Material::setAlbedoTexture(std::string filePath) {
    setAlbedoTexture(std::make_unique<fw::Texture>(filePath));
}